

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateRSTests.cpp
# Opt level: O0

void __thiscall
vkt::DynamicState::anon_unknown_0::DepthBiasBaseCase::beginRenderPassWithClearColor
          (DepthBiasBaseCase *this,VkClearColorValue *clearColor)

{
  DeviceInterface *pDVar1;
  VkCommandBuffer pVVar2;
  VkCommandBuffer_s *pVVar3;
  VkRect2D _renderArea;
  VkCommandBuffer_s **ppVVar4;
  Image *pIVar5;
  VkImage VVar6;
  Handle<(vk::HandleType)17> *pHVar7;
  Handle<(vk::HandleType)23> *pHVar8;
  Move<vk::VkCommandBuffer_s_*> *this_00;
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> local_168;
  VkOffset2D local_148;
  VkExtent2D VStack_140;
  VkFramebuffer local_130;
  VkRenderPass local_128;
  undefined1 local_120 [8];
  RenderPassBeginInfo renderPassBegin;
  VkRect2D renderArea;
  VkMemoryBarrier memBarrier;
  ImageSubresourceRange local_98;
  ImageSubresourceRange local_84;
  undefined8 local_70;
  VkClearDepthStencilValue depthStencilClearValue;
  undefined1 local_5c [8];
  ImageSubresourceRange subresourceRangeImage;
  undefined1 local_38 [8];
  CmdBufferBeginInfo beginInfo;
  VkClearColorValue *clearColor_local;
  DepthBiasBaseCase *this_local;
  
  beginInfo.super_VkCommandBufferBeginInfo.pInheritanceInfo =
       (VkCommandBufferInheritanceInfo *)clearColor;
  Draw::CmdBufferBeginInfo::CmdBufferBeginInfo((CmdBufferBeginInfo *)local_38,0);
  pDVar1 = this->m_vk;
  this_00 = &this->m_cmdBuffer;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x49])(pDVar1,*ppVVar4,(CmdBufferBeginInfo *)local_38);
  pDVar1 = this->m_vk;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar4;
  pIVar5 = de::SharedPtr<vkt::Draw::Image>::operator->(&this->m_colorTargetImage);
  VVar6 = Draw::Image::object(pIVar5);
  Draw::initialTransitionColor2DImage(pDVar1,pVVar2,VVar6,VK_IMAGE_LAYOUT_GENERAL);
  pDVar1 = this->m_vk;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar4;
  pIVar5 = de::SharedPtr<vkt::Draw::Image>::operator->(&this->m_depthStencilImage);
  subresourceRangeImage.super_VkImageSubresourceRange._12_8_ = Draw::Image::object(pIVar5);
  Draw::initialTransitionDepthStencil2DImage
            (pDVar1,pVVar2,(VkImage)subresourceRangeImage.super_VkImageSubresourceRange._12_8_,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0,0x1000);
  Draw::ImageSubresourceRange::ImageSubresourceRange((ImageSubresourceRange *)local_5c,1,0,1,0,1);
  pDVar1 = this->m_vk;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar3 = *ppVVar4;
  pIVar5 = de::SharedPtr<vkt::Draw::Image>::operator->(&this->m_colorTargetImage);
  depthStencilClearValue = (VkClearDepthStencilValue)Draw::Image::object(pIVar5);
  (*pDVar1->_vptr_DeviceInterface[0x66])
            (pDVar1,pVVar3,depthStencilClearValue,1,
             beginInfo.super_VkCommandBufferBeginInfo.pInheritanceInfo,1,
             (ImageSubresourceRange *)local_5c);
  local_70 = 0;
  Draw::ImageSubresourceRange::ImageSubresourceRange(&local_98,2,0,1,0,1);
  Draw::ImageSubresourceRange::ImageSubresourceRange(&local_84,4,0,1,0,1);
  pDVar1 = this->m_vk;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar3 = *ppVVar4;
  pIVar5 = de::SharedPtr<vkt::Draw::Image>::operator->(&this->m_depthStencilImage);
  VVar6 = Draw::Image::object(pIVar5);
  (*pDVar1->_vptr_DeviceInterface[0x67])(pDVar1,pVVar3,VVar6.m_internal,7,&local_70,2,&local_98);
  renderArea.extent.width = 0x2e;
  renderArea.extent.height = 0;
  pDVar1 = this->m_vk;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x6d])
            (pDVar1,*ppVVar4,0x1000,0x700,0,1,&renderArea.extent,0,0,0,0);
  renderPassBegin.m_clearValues.
  super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  renderArea.offset.x = 0x80;
  renderArea.offset.y = 0x80;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_128.m_internal = pHVar7->m_internal;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                     (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  local_130.m_internal = pHVar8->m_internal;
  local_148 = (VkOffset2D)
              renderPassBegin.m_clearValues.
              super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  VStack_140.width = renderArea.offset.x;
  VStack_140.height = renderArea.offset.y;
  local_168.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector(&local_168);
  _renderArea.extent = VStack_140;
  _renderArea.offset = local_148;
  Draw::RenderPassBeginInfo::RenderPassBeginInfo
            ((RenderPassBeginInfo *)local_120,local_128,local_130,_renderArea,&local_168);
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::~vector(&local_168);
  pDVar1 = this->m_vk;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar4;
  pIVar5 = de::SharedPtr<vkt::Draw::Image>::operator->(&this->m_depthStencilImage);
  VVar6 = Draw::Image::object(pIVar5);
  Draw::transition2DImage
            (pDVar1,pVVar2,VVar6,6,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,0x1000,0x400);
  pDVar1 = this->m_vk;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x74])(pDVar1,*ppVVar4,local_120,0);
  Draw::RenderPassBeginInfo::~RenderPassBeginInfo((RenderPassBeginInfo *)local_120);
  return;
}

Assistant:

void beginRenderPassWithClearColor (const vk::VkClearColorValue &clearColor)
	{
		const CmdBufferBeginInfo beginInfo;
		m_vk.beginCommandBuffer(*m_cmdBuffer, &beginInfo);

		initialTransitionColor2DImage(m_vk, *m_cmdBuffer, m_colorTargetImage->object(), vk::VK_IMAGE_LAYOUT_GENERAL);
		initialTransitionDepthStencil2DImage(m_vk, *m_cmdBuffer, m_depthStencilImage->object(), vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 0, vk::VK_ACCESS_TRANSFER_WRITE_BIT);

		const ImageSubresourceRange subresourceRangeImage(vk::VK_IMAGE_ASPECT_COLOR_BIT);
		m_vk.cmdClearColorImage(*m_cmdBuffer, m_colorTargetImage->object(),
								vk::VK_IMAGE_LAYOUT_GENERAL, &clearColor, 1, &subresourceRangeImage);

		const vk::VkClearDepthStencilValue depthStencilClearValue = { 0.0f, 0 };

		const ImageSubresourceRange subresourceRangeDepthStencil[2] = { vk::VK_IMAGE_ASPECT_DEPTH_BIT, vk::VK_IMAGE_ASPECT_STENCIL_BIT };

		m_vk.cmdClearDepthStencilImage(*m_cmdBuffer, m_depthStencilImage->object(),
									   vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, &depthStencilClearValue, 2, subresourceRangeDepthStencil);

		const vk::VkMemoryBarrier memBarrier =
		{
			vk::VK_STRUCTURE_TYPE_MEMORY_BARRIER,
			DE_NULL,
			vk::VK_ACCESS_TRANSFER_WRITE_BIT,
			vk::VK_ACCESS_COLOR_ATTACHMENT_READ_BIT | vk::VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT |
				vk::VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_READ_BIT | vk::VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT
		};

		m_vk.cmdPipelineBarrier(*m_cmdBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT,
			vk::VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT |
			vk::VK_PIPELINE_STAGE_EARLY_FRAGMENT_TESTS_BIT | vk::VK_PIPELINE_STAGE_LATE_FRAGMENT_TESTS_BIT,
			0, 1, &memBarrier, 0, DE_NULL, 0, DE_NULL);

		const vk::VkRect2D renderArea = { { 0, 0 }, { WIDTH, HEIGHT } };
		const RenderPassBeginInfo renderPassBegin(*m_renderPass, *m_framebuffer, renderArea);

		transition2DImage(m_vk, *m_cmdBuffer, m_depthStencilImage->object(), vk::VK_IMAGE_ASPECT_DEPTH_BIT | vk::VK_IMAGE_ASPECT_STENCIL_BIT, vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL, vk::VK_ACCESS_TRANSFER_WRITE_BIT, vk::VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT);

		m_vk.cmdBeginRenderPass(*m_cmdBuffer, &renderPassBegin, vk::VK_SUBPASS_CONTENTS_INLINE);
	}